

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystem.cpp
# Opt level: O2

void __thiscall chrono::ChSystem::StateGatherAcceleration(ChSystem *this,ChStateDelta *a)

{
  element_type *peVar1;
  
  ChAssembly::IntStateGatherAcceleration(&this->assembly,0,a);
  peVar1 = (this->contact_container).
           super___shared_ptr<chrono::ChContactContainer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*(peVar1->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x1d])
            (peVar1,(ulong)((peVar1->super_ChPhysicsItem).offset_w -
                           (this->assembly).super_ChPhysicsItem.offset_w),a);
  return;
}

Assistant:

void ChSystem::StateGatherAcceleration(ChStateDelta& a) {
    unsigned int off_a = 0;

    // Operate on assembly sub-objects (bodies, links, etc.)
    assembly.IntStateGatherAcceleration(off_a, a);

    // Use also on contact container:
    unsigned int displ_a = off_a - assembly.offset_w;
    contact_container->IntStateGatherAcceleration(displ_a + contact_container->GetOffset_w(), a);
}